

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

int64_t __thiscall leveldb::DBImpl::TEST_MaxNextLevelOverlappingBytes(DBImpl *this)

{
  int64_t iVar1;
  MutexLock local_18;
  MutexLock l;
  DBImpl *this_local;
  
  l.mu_ = (Mutex *)this;
  MutexLock::MutexLock(&local_18,&this->mutex_);
  iVar1 = VersionSet::MaxNextLevelOverlappingBytes(this->versions_);
  MutexLock::~MutexLock(&local_18);
  return iVar1;
}

Assistant:

int64_t DBImpl::TEST_MaxNextLevelOverlappingBytes() {
  MutexLock l(&mutex_);
  return versions_->MaxNextLevelOverlappingBytes();
}